

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop.c
# Opt level: O0

void timer_cb(uv_timer_t *handle)

{
  uv_timer_t *handle_local;
  
  if (handle != &timer) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-walk-handles.c"
            ,0x2d,"handle == &timer");
    abort();
  }
  uv_walk(timer.loop,walk_cb,magic_cookie);
  uv_close(&timer,0);
  return;
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  uv_buf_t buf = uv_buf_init("PING", 4);
  ASSERT(0 == uv_write(&write_req,
                       (uv_stream_t*) &tcp_handle,
                       &buf,
                       1,
                       write_cb));
  ASSERT(0 == uv_read_stop((uv_stream_t*) &tcp_handle));
}